

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O1

void __thiscall deqp::gls::QuadGrid::~QuadGrid(QuadGrid *this)

{
  pointer puVar1;
  void *pvVar2;
  pointer pfVar3;
  pointer pVVar4;
  pointer pTVar5;
  pointer pMVar6;
  long lVar7;
  
  puVar1 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_indices).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  lVar7 = 0;
  do {
    pvVar2 = *(void **)((long)&this->m_userAttribs[3].
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar7);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&this->m_userAttribs[3].
                                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar7) - (long)pvVar2);
    }
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x60);
  pfVar3 = (this->m_attribOne).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar3 != (pointer)0x0) {
    operator_delete(pfVar3,(long)(this->m_attribOne).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar3);
  }
  pVVar4 = (this->m_unitCoords).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4,(long)(this->m_unitCoords).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar4);
  }
  pVVar4 = (this->m_coords).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4,(long)(this->m_coords).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar4);
  }
  pVVar4 = (this->m_positions).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4,(long)(this->m_positions).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar4);
  }
  pVVar4 = (this->m_screenPos).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4,(long)(this->m_screenPos).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar4);
  }
  pTVar5 = (this->m_textures).
           super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar5 != (pointer)0x0) {
    operator_delete(pTVar5,(long)(this->m_textures).
                                 super__Vector_base<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar5);
  }
  pMVar6 = (this->m_userAttribTransforms).
           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pMVar6 != (pointer)0x0) {
    operator_delete(pMVar6,(long)(this->m_userAttribTransforms).
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar6);
    return;
  }
  return;
}

Assistant:

QuadGrid::~QuadGrid (void)
{
}